

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolAccess.cpp
# Opt level: O0

int __thiscall
bhf::ads::SymbolAccess::Write<unsigned_char>(SymbolAccess *this,SymbolEntry *entry,string *v)

{
  ushort uVar1;
  byte bVar2;
  long lVar3;
  ostream *poVar4;
  _func_ios_base_ptr_ios_base_ptr *local_6f8;
  undefined1 local_6d1;
  string local_6d0 [7];
  uint8_t value;
  stringstream local_6b0 [8];
  stringstream stream_2;
  ostream local_6a0 [380];
  undefined4 local_524;
  string local_520 [32];
  stringstream local_500 [8];
  stringstream stream_1;
  ostream local_4f0 [382];
  ushort local_372;
  stringstream asStack_370 [6];
  uint16_t integer_value;
  stringstream converter;
  undefined1 auStack_360 [383];
  byte local_1e1;
  string local_1e0 [7];
  bool asHex;
  stringstream local_1b0 [8];
  stringstream stream;
  ostream local_1a0 [376];
  string *local_28;
  string *v_local;
  SymbolEntry *entry_local;
  SymbolAccess *this_local;
  
  local_28 = v;
  v_local = (string *)entry;
  entry_local = (SymbolEntry *)this;
  lVar3 = std::__cxx11::string::size();
  if (lVar3 == 0) {
    std::__cxx11::stringstream::stringstream(local_1b0);
    poVar4 = std::operator<<(local_1a0,"Write");
    std::operator<<(poVar4,"<uint8_t>() empty strings are not supported\n");
    std::__cxx11::stringstream::str();
    Logger::Log(3,local_1e0);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1b0);
    this_local._4_4_ = 0x706;
  }
  else {
    lVar3 = std::__cxx11::string::rfind((char *)local_28,0x1a9681);
    local_1e1 = lVar3 != -1;
    std::__cxx11::stringstream::stringstream(asStack_370);
    if ((local_1e1 & 1) == 0) {
      local_6f8 = std::dec;
    }
    else {
      local_6f8 = std::hex;
    }
    poVar4 = (ostream *)std::ostream::operator<<(auStack_360,local_6f8);
    std::operator<<(poVar4,(string *)local_28);
    local_372 = 0;
    std::istream::operator>>(asStack_370,&local_372);
    bVar2 = std::ios::fail();
    uVar1 = local_372;
    if ((bVar2 & 1) == 0) {
      bVar2 = std::numeric_limits<unsigned_char>::max();
      if (bVar2 < uVar1) {
        std::__cxx11::stringstream::stringstream(local_6b0);
        poVar4 = std::operator<<(local_6a0,"Write");
        poVar4 = std::operator<<(poVar4,"() \'");
        poVar4 = std::operator<<(poVar4,(string *)local_28);
        std::operator<<(poVar4,"\' does not fit into a single byte\n");
        std::__cxx11::stringstream::str();
        Logger::Log(3,local_6d0);
        std::__cxx11::string::~string((string *)local_6d0);
        std::__cxx11::stringstream::~stringstream(local_6b0);
        this_local._4_4_ = 0x706;
      }
      else {
        local_6d1 = (undefined1)local_372;
        lVar3 = AdsDevice::WriteReqEx
                          (&this->device,*(uint32_t *)(v_local + 4),*(uint32_t *)(v_local + 8),1,
                           &local_6d1);
        this_local._4_4_ = (int)lVar3;
      }
    }
    else {
      std::__cxx11::stringstream::stringstream(local_500);
      poVar4 = std::operator<<(local_4f0,"Write");
      poVar4 = std::operator<<(poVar4,"() parsing \'");
      poVar4 = std::operator<<(poVar4,(string *)local_28);
      std::operator<<(poVar4,"\' failed\n");
      std::__cxx11::stringstream::str();
      Logger::Log(3,local_520);
      std::__cxx11::string::~string((string *)local_520);
      std::__cxx11::stringstream::~stringstream(local_500);
      this_local._4_4_ = 0x706;
    }
    local_524 = 1;
    std::__cxx11::stringstream::~stringstream(asStack_370);
  }
  return this_local._4_4_;
}

Assistant:

int SymbolAccess::Write<uint8_t>(const SymbolEntry& entry, const std::string& v) const
{
    if (!v.size()) {
        LOG_ERROR(__FUNCTION__ << "<uint8_t>() empty strings are not supported\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }

    const auto asHex = (v.npos != v.rfind("0x", 0));
    std::stringstream converter;
    converter << (asHex ? std::hex : std::dec) << v;

    uint16_t integer_value = {};
    converter >> integer_value;
    if (converter.fail()) {
        LOG_ERROR(__FUNCTION__ << "() parsing '" << v << "' failed\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    if (integer_value > std::numeric_limits<uint8_t>::max()) {
        LOG_ERROR(__FUNCTION__ << "() '" << v << "' does not fit into a single byte\n");
        return ADSERR_DEVICE_INVALIDDATA;
    }
    auto value = static_cast<uint8_t>(integer_value);
    return device.WriteReqEx(entry.header.iGroup,
                             entry.header.iOffs,
                             sizeof(value),
                             &value);
}